

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
::cni_holder(cni_holder<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
             *this,_func_int_path_info_ptr **func)

{
  function<int_(const_cs_impl::path_cs_ext::path_info_&)> *in_RDI;
  cni_helper<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
  *this_00;
  function<int_(const_cs_impl::path_cs_ext::path_info_&)> *in_stack_ffffffffffffffc0;
  _func_int_path_info_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003bd270;
  this_00 = (cni_helper<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<int(cs_impl::path_cs_ext::path_info_const&)>::
  function<int(*const&)(cs_impl::path_cs_ext::path_info_const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<int_(const_cs_impl::path_cs_ext::path_info_&)>::~function
            ((function<int_(const_cs_impl::path_cs_ext::path_info_&)> *)0x2d0de6);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}